

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcommandlinkbutton.cpp
# Opt level: O2

void QCommandLinkButton::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == WriteProperty) {
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QPushButton::setFlat((QPushButton *)_o,*(bool *)&(((QString *)*_a)->d).d);
        return;
      }
      goto LAB_003bdb45;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setDescription((QCommandLinkButton *)_o,(QString *)*_a);
        return;
      }
      goto LAB_003bdb45;
    }
  }
  else if (_c == ReadProperty) {
    puVar1 = (undefined8 *)*_a;
    if (_id == 1) {
      bVar5 = QPushButton::isFlat((QPushButton *)_o);
      *(bool *)puVar1 = bVar5;
    }
    else if (_id == 0) {
      description((QString *)&local_38,(QCommandLinkButton *)_o);
      pDVar3 = (Data *)*puVar1;
      pcVar4 = (char16_t *)puVar1[1];
      *puVar1 = local_38.d;
      puVar1[1] = local_38.ptr;
      qVar2 = puVar1[2];
      puVar1[2] = local_38.size;
      local_38.d = pDVar3;
      local_38.ptr = pcVar4;
      local_38.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003bdb45:
  __stack_chk_fail();
}

Assistant:

void QCommandLinkButton::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCommandLinkButton *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->description(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isFlat(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDescription(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setFlat(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}